

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

DynamicObject *
TTD::NSSnapObjects::ObjectPropertyReset_WellKnown
          (SnapObject *snpObject,DynamicObject *dynObj,InflateMap *inflator)

{
  long lVar1;
  RecyclableObject *pRVar2;
  _func_int **pp_Var3;
  bool bVar4;
  PropertyId pid_1;
  int iVar5;
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this;
  JavascriptArray *objArray;
  EntryType *pEVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 local_60 [8];
  EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  uint local_34 [2];
  PropertyId pid;
  
  iter.
  super_IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
  ._24_8_ = snpObject;
  if (snpObject->OptWellKnownToken == (TTD_WELLKNOWN_TOKEN)0x0) {
    TTDAbort_unrecoverable_error("Should only call this on well known objects.");
  }
  this = &InflateMap::GetPropertyResetSet(inflator)->
          super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ;
  JsUtil::
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this);
  iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[10])(dynObj);
  if (0 < iVar5) {
    uVar7 = 0;
    do {
      local_34[0] = (*(dynObj->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                              (dynObj,uVar7 & 0xffff);
      if (local_34[0] != 0xffffffff) {
        local_60._0_4_ = local_34[0];
        JsUtil::
        BaseDictionary<int,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<int,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                  ((BaseDictionary<int,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                    *)this,(int *)local_60,(int *)local_34);
      }
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
      iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(dynObj);
    } while ((int)uVar8 < iVar5);
  }
  lVar1 = *(long *)(*(long *)(iter.
                              super_IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                              ._24_8_ + 0x10) + 0x20);
  if (*(int *)(lVar1 + 0x10) != 0) {
    uVar7 = 0;
    do {
      uVar8 = *(uint *)(*(long *)(lVar1 + 0x18) + uVar7 * 8);
      if ((*(char *)(*(long *)(lVar1 + 0x18) + 4 + uVar7 * 8) != '\0') || (uVar8 < 0x10)) {
        local_60._0_4_ = uVar8;
        JsUtil::
        BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Remove(this,(int *)local_60);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(uint *)(lVar1 + 0x10));
  }
  if (this->count != this->freeCount) {
    pRVar2 = (((((((((dynObj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
              javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
    JsUtil::
    BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::EntryIterator((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                     *)local_60,
                    (BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)this);
    while( true ) {
      bVar4 = JsUtil::
              BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)local_60);
      if (!bVar4) break;
      pEVar6 = JsUtil::
               BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_60);
      uVar8 = (pEVar6->
              super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ).super_ImplicitKeyValueEntry<int,_int>.
              super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
              super_ValueEntryData<int>.value;
      if (0xffffffee < uVar8 - 0x10) {
        TTDAbort_unrecoverable_error("This shouldn\'t happen!!!");
      }
      iVar5 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                        (dynObj,(ulong)uVar8);
      pp_Var3 = (dynObj->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      if (iVar5 == 0) {
        iVar5 = (*pp_Var3[0x17])(dynObj,(ulong)uVar8,pRVar2,8,0);
      }
      else {
        iVar5 = (*pp_Var3[0x21])(dynObj,(ulong)uVar8,8);
      }
      if (iVar5 == 0) {
        TTDAbort_unrecoverable_error("This property is stuck!!!");
      }
      JsUtil::
      BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseHashSet<int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)local_60);
    }
  }
  JsUtil::
  BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear(this);
  bVar4 = Js::DynamicObject::HasObjectArray(dynObj);
  if ((bVar4) && (dynObj->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0)) {
    objArray = Js::JavascriptLibrary::CreateArray
                         ((((dynObj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr);
    Js::DynamicObject::SetObjectArray(dynObj,&objArray->super_ArrayObject);
  }
  return dynObj;
}

Assistant:

Js::DynamicObject* ObjectPropertyReset_WellKnown(const SnapObject* snpObject, Js::DynamicObject* dynObj, InflateMap* inflator)
        {
            TTDAssert(snpObject->OptWellKnownToken != TTD_INVALID_WELLKNOWN_TOKEN, "Should only call this on well known objects.");

            JsUtil::BaseHashSet<Js::PropertyId, HeapAllocator>& propertyReset = inflator->GetPropertyResetSet();
            propertyReset.Clear();

            ////
            for(int32 i = 0; i < dynObj->GetPropertyCount(); i++)
            {
                Js::PropertyId pid = dynObj->GetPropertyId((Js::PropertyIndex)i);
                if(pid != Js::Constants::NoProperty)
                {
                    propertyReset.AddNew(pid);
                }
            }

            const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;
            for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
            {
                BOOL willOverwriteLater = (handler->PropertyInfoArray[i].DataKind != NSSnapType::SnapEntryDataKindTag::Clear);
                BOOL isInternal = Js::IsInternalPropertyId(handler->PropertyInfoArray[i].PropertyRecordId);

                if(willOverwriteLater | isInternal)
                {
                    Js::PropertyId pid = handler->PropertyInfoArray[i].PropertyRecordId;
                    propertyReset.Remove(pid);
                }
            }

            Js::Var undefined = dynObj->GetScriptContext()->GetLibrary()->GetUndefined();
            if(propertyReset.Count() != 0)
            {
                for(auto iter = propertyReset.GetIterator(); iter.IsValid(); iter.MoveNext())
                {
                    BOOL ok = FALSE;
                    Js::PropertyId pid = iter.CurrentValue();
                    TTDAssert(pid != Js::Constants::NoProperty && !Js::IsInternalPropertyId(pid), "This shouldn't happen!!!");

                    if(!dynObj->IsConfigurable(pid))
                    {
                        ok = dynObj->SetProperty(pid, undefined, Js::PropertyOperationFlags::PropertyOperation_Force, nullptr);
                    }
                    else
                    {
                        ok = dynObj->DeleteProperty(pid, Js::PropertyOperationFlags::PropertyOperation_Force);
                    }

                    TTDAssert(ok, "This property is stuck!!!");
                }
            }

            propertyReset.Clear();
            ////

            //always reset the index array as this is unusual and annoying to iterate over a bunch
            Js::ArrayObject* parray = dynObj->GetObjectArray();
            if(parray != nullptr)
            {
                Js::JavascriptArray* newArray = dynObj->GetLibrary()->CreateArray();
                dynObj->SetObjectArray(newArray);
            }

            return dynObj;
        }